

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

int impl_GLSL_MaxUniforms(MOJOSHADER_shaderType shader_type)

{
  GLenum local_18;
  GLenum local_14;
  GLint val;
  GLenum pname;
  MOJOSHADER_shaderType shader_type_local;
  
  local_18 = 0;
  if (shader_type == MOJOSHADER_TYPE_VERTEX) {
    local_14 = 0x8b4a;
  }
  else {
    if (shader_type != MOJOSHADER_TYPE_PIXEL) {
      return -1;
    }
    local_14 = 0x8b49;
  }
  val = shader_type;
  (*ctx->glGetIntegerv)(local_14,(GLint *)&local_18);
  return local_18;
}

Assistant:

static int impl_GLSL_MaxUniforms(MOJOSHADER_shaderType shader_type)
{
    // these enums match between core 2.0 and the ARB extensions.
    GLenum pname = GL_NONE;
    GLint val = 0;
    if (shader_type == MOJOSHADER_TYPE_VERTEX)
        pname = GL_MAX_VERTEX_UNIFORM_COMPONENTS;
    else if (shader_type == MOJOSHADER_TYPE_PIXEL)
        pname = GL_MAX_FRAGMENT_UNIFORM_COMPONENTS;
    else
        return -1;

    ctx->glGetIntegerv(pname, &val);
    return (int) val;
}